

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

int Tas_StorePattern(Vec_Ptr_t *vSimInfo,Vec_Ptr_t *vPres,Vec_Int_t *vCex)

{
  uint uVar1;
  int iVar2;
  uint iBit;
  
  uVar1 = 1;
  do {
    iBit = uVar1;
    if (iBit == 0x20) break;
    iVar2 = Tas_StorePatternTry(vSimInfo,vPres,iBit,vCex->pArray,vCex->nSize);
    uVar1 = iBit + 1;
  } while (iVar2 == 0);
  return (int)(iBit < 0x20);
}

Assistant:

int Tas_StorePattern( Vec_Ptr_t * vSimInfo, Vec_Ptr_t * vPres, Vec_Int_t * vCex )
{
    int k;
    for ( k = 1; k < 32; k++ )
        if ( Tas_StorePatternTry( vSimInfo, vPres, k, (int *)Vec_IntArray(vCex), Vec_IntSize(vCex) ) )
            break;
    return (int)(k < 32);
}